

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ec_point_add_extension(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  undefined1 local_80 [8];
  CBB formats;
  CBB contents;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  iVar1 = CBB_add_u16(out,0xb);
  if ((((iVar1 != 0) &&
       (iVar1 = CBB_add_u16_length_prefixed(out,(CBB *)((long)&formats.u + 0x18)), iVar1 != 0)) &&
      (iVar1 = CBB_add_u8_length_prefixed((CBB *)((long)&formats.u + 0x18),(CBB *)local_80),
      iVar1 != 0)) &&
     ((iVar1 = CBB_add_u8((CBB *)local_80,'\0'), iVar1 != 0 && (iVar1 = CBB_flush(out), iVar1 != 0))
     )) {
    return true;
  }
  return false;
}

Assistant:

static bool ext_ec_point_add_extension(const SSL_HANDSHAKE *hs, CBB *out) {
  CBB contents, formats;
  if (!CBB_add_u16(out, TLSEXT_TYPE_ec_point_formats) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u8_length_prefixed(&contents, &formats) ||
      !CBB_add_u8(&formats, TLSEXT_ECPOINTFORMAT_uncompressed) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}